

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void google::protobuf::internal::ExtensionSet::RegisterMessageExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed,
               MessageLite *prototype,LazyEagerVerifyFnType verify_func,LazyAnnotation is_lazy)

{
  MessageLite *pMVar1;
  LogMessage *pLVar2;
  undefined1 local_80 [8];
  ExtensionInfo info;
  LogMessage local_38;
  Voidify local_21;
  MessageLite *local_20;
  MessageLite *prototype_local;
  bool is_packed_local;
  bool is_repeated_local;
  FieldType type_local;
  MessageLite *pMStack_10;
  int number_local;
  MessageLite *extendee_local;
  
  local_20 = prototype;
  prototype_local._1_1_ = is_packed;
  prototype_local._2_1_ = is_repeated;
  prototype_local._3_1_ = type;
  prototype_local._4_4_ = number;
  pMStack_10 = extendee;
  if (type == '\v' || type == '\n') {
    ExtensionInfo::ExtensionInfo
              ((ExtensionInfo *)local_80,extendee,number,type,is_repeated,is_packed,verify_func,
               is_lazy);
    pMVar1 = local_20;
    info.field_6.message_info.prototype = (MessageLite *)MessageLite::GetTcParseTable(local_20);
    info._8_8_ = pMVar1;
    anon_unknown_59::Register((ExtensionInfo *)local_80);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,0xa3,"type == WireFormatLite::TYPE_MESSAGE || type == WireFormatLite::TYPE_GROUP");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

void ExtensionSet::RegisterMessageExtension(const MessageLite* extendee,
                                            int number, FieldType type,
                                            bool is_repeated, bool is_packed,
                                            const MessageLite* prototype,
                                            LazyEagerVerifyFnType verify_func,
                                            LazyAnnotation is_lazy) {
  ABSL_CHECK(type == WireFormatLite::TYPE_MESSAGE ||
             type == WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed,
                     verify_func, is_lazy);
  info.message_info = {prototype,
#if defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
                       prototype->GetTcParseTable()
#else
                       nullptr
#endif
  }